

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedFloats::_internal_add_values
          (TensorValue_RepeatedFloats *this,float value)

{
  float local_4;
  
  google::protobuf::RepeatedField<float>::Add(&this->values_,&local_4);
  return;
}

Assistant:

inline void TensorValue_RepeatedFloats::_internal_add_values(float value) {
  values_.Add(value);
}